

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<short,int>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  short ret_1;
  short ret;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_3a;
  uint local_38;
  short local_32;
  
  local_3a.m_int = 1;
  local_38 = 1;
  local_32 = 0;
  DivisionHelper<short,_int,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_3a.m_int,(int *)&local_38,&local_32);
  local_38 = local_38 & 0xffff0000;
  local_32 = 1;
  DivisionHelper<short,_short,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_3a.m_int,&local_32,(short *)&local_38);
  operator/(1,local_3a);
  local_38 = 1;
  DivisionHelper<short,_int,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_3a.m_int,(int *)&local_38,&local_3a.m_int);
  local_38 = 1;
  DivisionHelper<short,_int,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_3a.m_int,(int *)&local_38,&local_3a.m_int);
  if (((0xfffffffffffeffff < (long)local_3a.m_int - 0x7fffU) &&
      (0xfffeffff < (int)local_3a.m_int - 0x7fffU)) &&
     (local_3a.m_int = local_3a.m_int + 1, 0xfffffffffffeffff < (long)local_3a.m_int - 0x7fffU)) {
    local_3a.m_int = 0;
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_3a,1);
    SVar1 = SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_3a,
                       (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    operator<<(SVar1.m_int,(SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_3a,1);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_3a,
               (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_3a,1);
    SVar1 = SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_3a,
                       (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    operator>>(SVar1.m_int,(SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_3a,1);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_3a,
               (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}